

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

int xmlIsID(xmlDocPtr doc,xmlNodePtr elem,xmlAttrPtr attr)

{
  xmlHashTablePtr pxVar1;
  int iVar2;
  xmlChar *pxVar3;
  void *pvVar4;
  xmlChar *pxVar5;
  xmlNs *pxVar6;
  xmlChar felem [50];
  xmlChar axStack_68 [56];
  
  if ((attr != (xmlAttrPtr)0x0) && (pxVar3 = attr->name, pxVar3 != (xmlChar *)0x0)) {
    if ((doc == (xmlDocPtr)0x0) || (doc->type != XML_HTML_DOCUMENT_NODE)) {
      pxVar6 = attr->ns;
      if ((((pxVar6 == (xmlNs *)0x0) || (pxVar6->prefix == (xmlChar *)0x0)) || (*pxVar3 != 'i')) ||
         ((pxVar3[1] != 'd' || (pxVar3[2] != '\0')))) {
        if (doc == (xmlDocPtr)0x0) {
          return 0;
        }
      }
      else {
        iVar2 = strcmp((char *)pxVar6->prefix,"xml");
        if (doc == (xmlDocPtr)0x0) {
          return (uint)(iVar2 == 0);
        }
        if (iVar2 == 0) {
          return (uint)(iVar2 == 0);
        }
      }
      if (doc->intSubset == (_xmlDtd *)0x0) {
        if (elem == (xmlNodePtr)0x0) {
          return 0;
        }
        if (doc->extSubset == (_xmlDtd *)0x0) {
          return 0;
        }
      }
      else if (elem == (xmlNodePtr)0x0) {
        return 0;
      }
      if (elem->type != XML_ELEMENT_NODE) {
        return 0;
      }
      pxVar3 = elem->name;
      if (pxVar3 == (xmlChar *)0x0) {
        return 0;
      }
      if ((elem->ns != (xmlNs *)0x0) && (pxVar5 = elem->ns->prefix, pxVar5 != (xmlChar *)0x0)) {
        pxVar3 = xmlBuildQName(pxVar3,pxVar5,axStack_68,0x32);
        if (pxVar3 == (xmlChar *)0x0) {
          return -1;
        }
        pxVar6 = attr->ns;
      }
      if (pxVar6 == (xmlNs *)0x0) {
        pxVar5 = (xmlChar *)0x0;
      }
      else {
        pxVar5 = pxVar6->prefix;
      }
      if (((doc->intSubset == (_xmlDtd *)0x0) ||
          (pxVar1 = (xmlHashTablePtr)doc->intSubset->attributes, pxVar1 == (xmlHashTablePtr)0x0)) ||
         (pvVar4 = xmlHashLookup3(pxVar1,attr->name,pxVar5,pxVar3), pvVar4 == (void *)0x0)) {
        if ((doc->extSubset == (_xmlDtd *)0x0) ||
           (pxVar1 = (xmlHashTablePtr)doc->extSubset->attributes, pxVar1 == (xmlHashTablePtr)0x0)) {
          pvVar4 = (void *)0x0;
        }
        else {
          pvVar4 = xmlHashLookup3(pxVar1,attr->name,pxVar5,pxVar3);
        }
      }
      if ((pxVar3 != axStack_68) && (pxVar3 != elem->name)) {
        (*xmlFree)(pxVar3);
      }
      if ((pvVar4 != (void *)0x0) && (*(int *)((long)pvVar4 + 0x50) == 2)) {
        return 1;
      }
    }
    else {
      iVar2 = xmlStrEqual("id",pxVar3);
      if (iVar2 != 0) {
        return 1;
      }
      if ((((elem != (xmlNodePtr)0x0) && (elem->type == XML_ELEMENT_NODE)) &&
          (iVar2 = xmlStrEqual("name",attr->name), iVar2 != 0)) &&
         (iVar2 = xmlStrEqual(elem->name,"a"), iVar2 != 0)) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int
xmlIsID(xmlDocPtr doc, xmlNodePtr elem, xmlAttrPtr attr) {
    if ((attr == NULL) || (attr->name == NULL))
        return(0);

    if ((doc != NULL) && (doc->type == XML_HTML_DOCUMENT_NODE)) {
        if (xmlStrEqual(BAD_CAST "id", attr->name))
            return(1);

        if ((elem == NULL) || (elem->type != XML_ELEMENT_NODE))
            return(0);

        if ((xmlStrEqual(BAD_CAST "name", attr->name)) &&
	    (xmlStrEqual(elem->name, BAD_CAST "a")))
	    return(1);
    } else {
	xmlAttributePtr attrDecl = NULL;
	xmlChar felem[50];
	xmlChar *fullelemname;
        const xmlChar *aprefix;

        if ((attr->ns != NULL) && (attr->ns->prefix != NULL) &&
            (!strcmp((char *) attr->name, "id")) &&
            (!strcmp((char *) attr->ns->prefix, "xml")))
            return(1);

        if ((doc == NULL) ||
            ((doc->intSubset == NULL) && (doc->extSubset == NULL)))
            return(0);

        if ((elem == NULL) ||
            (elem->type != XML_ELEMENT_NODE) ||
            (elem->name == NULL))
            return(0);

	fullelemname = (elem->ns != NULL && elem->ns->prefix != NULL) ?
	    xmlBuildQName(elem->name, elem->ns->prefix, felem, 50) :
	    (xmlChar *)elem->name;
        if (fullelemname == NULL)
            return(-1);

        aprefix = (attr->ns != NULL) ? attr->ns->prefix : NULL;

	if (fullelemname != NULL) {
	    attrDecl = xmlGetDtdQAttrDesc(doc->intSubset, fullelemname,
		                          attr->name, aprefix);
	    if ((attrDecl == NULL) && (doc->extSubset != NULL))
		attrDecl = xmlGetDtdQAttrDesc(doc->extSubset, fullelemname,
					      attr->name, aprefix);
	}

	if ((fullelemname != felem) && (fullelemname != elem->name))
	    xmlFree(fullelemname);

        if ((attrDecl != NULL) && (attrDecl->atype == XML_ATTRIBUTE_ID))
	    return(1);
    }

    return(0);
}